

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void dequantize_row_tq1_0(block_tq1_0 *x,float *y,int64_t k)

{
  float fVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  size_t n;
  long lVar5;
  long lVar6;
  block_tq1_0 *pbVar7;
  size_t m;
  long lVar8;
  
  lVar6 = k + 0xff;
  if (-1 < k) {
    lVar6 = k;
  }
  if (0xff < k) {
    lVar4 = 0;
    pbVar7 = x;
    do {
      fVar1 = ggml_table_f32_f16[x[lVar4].d];
      lVar5 = 0;
      do {
        cVar2 = (&DAT_0014ecf4)[lVar5];
        lVar8 = 0;
        do {
          bVar3 = cVar2 * pbVar7->qs[lVar8];
          *y = (float)(int)(((uint)bVar3 + (uint)bVar3 * 2 >> 8) - 1) * fVar1;
          y = y + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x20);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      lVar5 = 0;
      do {
        cVar2 = (&DAT_0014ecf4)[lVar5];
        lVar8 = 0x20;
        do {
          bVar3 = cVar2 * pbVar7->qs[lVar8];
          *y = (float)(int)(((uint)bVar3 + (uint)bVar3 * 2 >> 8) - 1) * fVar1;
          y = y + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x30);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      lVar5 = 0;
      do {
        cVar2 = (&DAT_0014ecf4)[lVar5];
        lVar8 = 0x30;
        do {
          bVar3 = cVar2 * pbVar7->qs[lVar8];
          *y = (float)(int)(((uint)bVar3 + (uint)bVar3 * 2 >> 8) - 1) * fVar1;
          y = y + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x34);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      lVar4 = lVar4 + 1;
      pbVar7 = pbVar7 + 1;
    } while (lVar4 != lVar6 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_tq1_0(const block_tq1_0 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    const uint8_t pow3[6] = {1, 3, 9, 27, 81, 243};

    for (int64_t i = 0; i < nb; ++i) {

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (size_t j = 0; j < sizeof(x->qs) - sizeof(x->qs) % 32; j += 32) {
            for (size_t n = 0; n < 5; ++n) {
                for (size_t m = 0; m < 32; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[n];
                    int16_t xi = ((uint16_t) q * 3) >> 8;
                    *y++ = (float) (xi - 1) * d;
                }
            }
        }
        for (size_t j = sizeof(x->qs) - sizeof(x->qs) % 32; j < sizeof(x->qs); j += 16) {
            for (size_t n = 0; n < 5; ++n) {
                for (size_t m = 0; m < 16; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[n];
                    int16_t xi = ((uint16_t) q * 3) >> 8;
                    *y++ = (float) (xi - 1) * d;
                }
            }
        }

        for (size_t n = 0; n < 4; ++n) {
            for (size_t j = 0; j < sizeof(x->qh); ++j) {
                uint8_t q = x[i].qh[j] * pow3[n];
                int16_t xi = ((uint16_t) q * 3) >> 8;
                *y++ = (float) (xi - 1) * d;
            }
        }
    }
}